

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pagecontrol.cpp
# Opt level: O3

void __thiscall QtMWidgets::PageControl::paintEvent(PageControl *this,QPaintEvent *param_1)

{
  int iVar1;
  reference pQVar2;
  long lVar3;
  long lVar4;
  PageControlPrivate *pPVar5;
  ulong i;
  QPainter p;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  QPainter local_28 [8];
  
  QPainter::QPainter(local_28,(QPaintDevice *)&this->field_0x10);
  QPainter::setRenderHint((RenderHint)local_28,true);
  QPainter::setPen((QColor *)local_28);
  pPVar5 = (this->d).d;
  if (0 < pPVar5->count) {
    i = 0;
    do {
      if (i == (uint)pPVar5->currentIndex) {
        QBrush::QBrush((QBrush *)&local_38,&pPVar5->currentPageIndicatorColor,SolidPattern);
        QPainter::setBrush((QBrush *)local_28);
        QBrush::~QBrush((QBrush *)&local_38);
        pQVar2 = QList<QRect>::operator[](&((this->d).d)->rectangles,i);
        lVar4 = (long)pQVar2->x2 + (long)pQVar2->x1;
        lVar3 = (long)pQVar2->y2 + (long)pQVar2->y1;
        iVar1 = ((this->d).d)->radius;
        local_38 = (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) - iVar1;
        local_34 = (int)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 1) - iVar1;
        local_30 = local_38 + iVar1 * 2 + -1;
        local_2c = local_34 + -1 + iVar1 * 2;
        QPainter::drawEllipse((QRect *)local_28);
      }
      else {
        QBrush::QBrush((QBrush *)&local_38,&pPVar5->pageIndicatorColor,SolidPattern);
        QPainter::setBrush((QBrush *)local_28);
        QBrush::~QBrush((QBrush *)&local_38);
        pQVar2 = QList<QRect>::operator[](&((this->d).d)->rectangles,i);
        lVar4 = (long)pQVar2->x2 + (long)pQVar2->x1;
        lVar3 = (long)pQVar2->y2 + (long)pQVar2->y1;
        iVar1 = ((this->d).d)->smallRadius;
        local_38 = (int)((ulong)(lVar4 - (lVar4 >> 0x3f)) >> 1) - iVar1;
        local_34 = (int)((ulong)(lVar3 - (lVar3 >> 0x3f)) >> 1) - iVar1;
        local_30 = local_38 + iVar1 * 2 + -1;
        local_2c = local_34 + -1 + iVar1 * 2;
        QPainter::drawEllipse((QRect *)local_28);
      }
      i = i + 1;
      pPVar5 = (this->d).d;
    } while ((long)i < (long)pPVar5->count);
  }
  QPainter::~QPainter(local_28);
  return;
}

Assistant:

void
PageControl::paintEvent( QPaintEvent * )
{
	QPainter p( this );
	p.setRenderHint( QPainter::Antialiasing );
	p.setPen( d->pageIndicatorColor );

	for( int i = 0; i < d->count; ++i )
	{
		if( i == d->currentIndex )
		{
			p.setBrush( d->currentPageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(), d->radius, d->radius );
		}
		else
		{
			p.setBrush( d->pageIndicatorColor );

			p.drawEllipse( d->rectangles[ i ].center(),
				d->smallRadius, d->smallRadius );
		}
	}
}